

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

string * GetTxnOutputType_abi_cxx11_(string *__return_storage_ptr__,TxoutType t)

{
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(t) {
  case NONSTANDARD:
    __s = "nonstandard";
    break;
  case ANCHOR:
    __s = "anchor";
    break;
  case PUBKEY:
    __s = "pubkey";
    break;
  case PUBKEYHASH:
    __s = "pubkeyhash";
    break;
  case SCRIPTHASH:
    __s = "scripthash";
    break;
  case MULTISIG:
    __s = "multisig";
    break;
  case NULL_DATA:
    __s = "nulldata";
    break;
  case WITNESS_V0_SCRIPTHASH:
    __s = "witness_v0_scripthash";
    break;
  case WITNESS_V0_KEYHASH:
    __s = "witness_v0_keyhash";
    break;
  case WITNESS_V1_TAPROOT:
    __s = "witness_v1_taproot";
    break;
  case WITNESS_UNKNOWN:
    __s = "witness_unknown";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/solver.cpp"
                  ,0x21,"std::string GetTxnOutputType(TxoutType)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTxnOutputType(TxoutType t)
{
    switch (t) {
    case TxoutType::NONSTANDARD: return "nonstandard";
    case TxoutType::PUBKEY: return "pubkey";
    case TxoutType::PUBKEYHASH: return "pubkeyhash";
    case TxoutType::SCRIPTHASH: return "scripthash";
    case TxoutType::MULTISIG: return "multisig";
    case TxoutType::NULL_DATA: return "nulldata";
    case TxoutType::ANCHOR: return "anchor";
    case TxoutType::WITNESS_V0_KEYHASH: return "witness_v0_keyhash";
    case TxoutType::WITNESS_V0_SCRIPTHASH: return "witness_v0_scripthash";
    case TxoutType::WITNESS_V1_TAPROOT: return "witness_v1_taproot";
    case TxoutType::WITNESS_UNKNOWN: return "witness_unknown";
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}